

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,false>
::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,false>
           *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *dst)

{
  double dVar1;
  PointerType pdVar2;
  PointerType pdVar3;
  long lVar4;
  long *plVar5;
  void *__s;
  undefined8 *puVar6;
  ulong uVar7;
  char *__function;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Index size;
  ulong uVar12;
  
  pdVar2 = *(PointerType *)(this + 8);
  pdVar3 = (dst->
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data;
  if (pdVar3 == pdVar2) {
    plVar5 = *(long **)this;
    uVar12 = plVar5[1];
    if ((uVar12 & 0xffffffff) == 0) {
      __s = (void *)0x0;
    }
    else {
      uVar12 = (ulong)(int)uVar12;
      __s = malloc(uVar12);
      if (__s == (void *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = std::streambuf::xsgetn;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if ((long)uVar12 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                      ,0xe1,
                      "Eigen::Matrix<bool, -1, 1, 0, -1>::Matrix(Index) [_Scalar = bool, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                     );
      }
      uVar11 = 0;
      memset(__s,0,uVar12);
      do {
        if (uVar12 <= uVar11) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x17a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<bool, -1, 1, 0, -1>, 1>::operator[](Index) [Derived = Eigen::Matrix<bool, -1, 1, 0, -1>, Level = 1]"
                       );
        }
        if (*(char *)((long)__s + uVar11) != '\x01') {
          *(undefined1 *)((long)__s + uVar11) = 1;
          lVar4 = *plVar5;
          iVar8 = *(int *)(lVar4 + uVar11 * 4);
          while (uVar7 = (ulong)iVar8, uVar11 != uVar7) {
            if (((iVar8 < 0) ||
                (lVar9 = (dst->
                         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                         ).
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                         .m_rows.m_value, lVar9 <= (long)uVar7)) || (lVar9 <= (long)uVar11))
            goto LAB_00166406;
            dVar1 = pdVar3[uVar7];
            pdVar3[uVar7] = pdVar3[uVar11];
            pdVar3[uVar11] = dVar1;
            *(undefined1 *)((long)__s + uVar7) = 1;
            iVar8 = *(int *)(lVar4 + uVar7 * 4);
          }
        }
        uVar11 = uVar11 + 1;
      } while ((long)uVar11 < (long)uVar12);
    }
    free(__s);
    return;
  }
  lVar4 = *(long *)(this + 0x10);
  if (0 < lVar4) {
    plVar5 = *(long **)this;
    lVar9 = 0;
    do {
      if (*(long *)(this + 0x10) <= lVar9) {
        __function = 
        "Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 1, 1>::Block(XprType &, Index) [XprType = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0016641b;
      }
      lVar10 = (long)*(int *)(*plVar5 + lVar9 * 4);
      if ((lVar10 < 0) ||
         ((dst->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value <= lVar10)) goto LAB_00166406;
      pdVar3[lVar10] = pdVar2[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  return;
LAB_00166406:
  __function = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 1, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0016641b:
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                ,0x76,__function);
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && extract_data(dst) == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }